

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

void __thiscall Client::run(Client *this)

{
  uint fd;
  int iVar1;
  uint uVar2;
  int iVar3;
  epoll_event *peVar4;
  int i;
  
  Epoll::add_event(&this->_epoll,this->_sock_fd,1);
  Epoll::add_event(&this->_epoll,0,1);
  do {
    iVar1 = Epoll::wait(&this->_epoll,(void *)0x3e8);
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    for (i = 0; iVar1 != i; i = i + 1) {
      peVar4 = Epoll::get(&this->_epoll,i);
      if ((peVar4->events & 1) == 0) {
        if ((peVar4->events & 4) != 0) {
          uVar2 = (peVar4->data).fd;
          fprintf(_stderr,"%s(%d)-<%s>: epollout fd %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
                  ,0x65,"run",(ulong)uVar2);
          fflush(_stderr);
          iVar3 = do_send(this,uVar2);
          if (iVar3 == 0) {
            if (uVar2 == 1) {
              Epoll::del_event(&this->_epoll,1,4);
            }
            else if (uVar2 == this->_sock_fd) {
              iVar3 = 1;
              goto LAB_001019b9;
            }
          }
          else if (iVar3 == -7) {
            return;
          }
        }
      }
      else {
        fd = (peVar4->data).fd;
        fprintf(_stderr,"%s(%d)-<%s>: epollin fd %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
                ,0x3c,"run",(ulong)fd);
        fflush(_stderr);
        uVar2 = do_recv(this,fd);
        if (uVar2 == 0) {
          uVar2 = this->_sock_fd;
          if (fd == 0) {
LAB_001019b4:
            iVar3 = 4;
LAB_001019b9:
            Epoll::modify_event(&this->_epoll,uVar2,iVar3);
          }
          else if (fd == uVar2) {
            Epoll::add_event(&this->_epoll,1,4);
          }
        }
        else {
          if (0xfffffffd < uVar2) {
            return;
          }
          if (uVar2 == 0xfffffffa) {
            if ((fd == 0) && ((this->_stdin2sock)._r_pos != (this->_stdin2sock)._w_pos)) {
              uVar2 = this->_sock_fd;
              goto LAB_001019b4;
            }
            if ((((fd == this->_sock_fd) &&
                 ((this->_sock2stdout)._r_pos != (this->_sock2stdout)._w_pos)) &&
                (iVar3 = Epoll::add_event(&this->_epoll,1,4), iVar3 < 0)) &&
               (iVar3 = Epoll::modify_event(&this->_epoll,1,4), iVar3 < 0)) {
              fprintf(_stderr,"%s(%d)-<%s>: can\'t add or modify stdout to epoll_ctl\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
                      ,0x5b,"run");
              fflush(_stderr);
              exit(1);
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

void Client::run()
{
    _epoll.add_event(_sock_fd, EPOLLIN);
    _epoll.add_event(STDIN_FILENO, EPOLLIN);

    
    while (true)
    {
        int nfds = _epoll.wait(kWaitMS);
        // LOG_PRINT("epoll wait get ready %d fds", nfds);

        for (int i = 0; i < nfds; ++i)
        {
            struct epoll_event &cur_ev = _epoll.get(i);

            if (cur_ev.events & EPOLLIN)
            {
                int cur_fd = cur_ev.data.fd;
                LOG_PRINT("epollin fd %d", cur_fd);
                int ret = do_recv(cur_fd);
                if (ret == err_clt_recv_normal)
                {
                    if (cur_fd == STDIN_FILENO)
                    {
                        _epoll.modify_event(_sock_fd, EPOLLOUT);
                    }
                    else if (cur_fd == _sock_fd)
                    {
                        _epoll.add_event(STDOUT_FILENO, EPOLLOUT);
                    }
                }
                else if (ret == err_clt_recv_disconn || ret == err_clt_recv_svrcrash)
                {
                    return ;
                }
                else if (ret == err_clt_recv_nospace)
                {
                    if (cur_fd == STDIN_FILENO && _stdin2sock.data_size() > 0)
                    {
                        _epoll.modify_event(_sock_fd, EPOLLOUT);
                    }
                    else if (cur_fd == _sock_fd && _sock2stdout.data_size() > 0)
                    {
                        int ret = _epoll.add_event(STDOUT_FILENO, EPOLLOUT);
                        if (ret < 0)
                        {
                            ret = _epoll.modify_event(STDOUT_FILENO, EPOLLOUT);
                            if (ret < 0)
                            {
                                LOG_PRINT("can't add or modify stdout to epoll_ctl");
                                exit(EXIT_FAILURE);
                            }
                        }
                    }
                }
            }
            else if (cur_ev.events & EPOLLOUT)
            {
                int cur_fd = cur_ev.data.fd;
                LOG_PRINT("epollout fd %d", cur_fd);

                int ret = do_send(cur_fd);

                if (ret == err_clt_send_shutdown_rd)
                {
                    return ;
                }
                else if (ret == err_clt_send_normal)
                {
                    if (cur_fd == STDOUT_FILENO)
                    {
                        _epoll.del_event(STDOUT_FILENO, EPOLLOUT);
                    }
                    else if (cur_fd == _sock_fd)
                    {
                        _epoll.modify_event(_sock_fd, EPOLLIN);
                    }
                }
            }
        }
    }
}